

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetwindow.cpp
# Opt level: O2

void __thiscall QWidgetWindow::scheduleRepaint(QWidgetWindow *this)

{
  uint uVar1;
  QWidgetRepaintManager *this_00;
  Data *pDVar2;
  long lVar3;
  QWidget *pQVar4;
  long in_FS_OFFSET;
  QRect QVar5;
  QRect local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = QWindow::screen();
  if (lVar3 != 0) {
    pQVar4 = (QWidget *)(this->m_widget).wp.value;
    uVar1 = pQVar4->data->widget_attributes;
    if (((short)uVar1 < 0) && ((uVar1 >> 10 & 1) == 0)) {
      QVar5 = QWidget::rect(pQVar4);
      if ((QVar5.x1.m_i.m_i <= QVar5.x2.m_i.m_i) && (QVar5.y1.m_i.m_i <= QVar5.y2.m_i.m_i)) {
        pQVar4 = QWidget::window((QWidget *)(this->m_widget).wp.value);
        lVar3 = *(long *)(*(long *)&pQVar4->field_0x8 + 0x78);
        if (((lVar3 != 0) && (lVar3 = *(long *)(lVar3 + 8), lVar3 != 0)) &&
           (*(long *)(lVar3 + 0x10) != 0)) {
          this_00 = *(QWidgetRepaintManager **)(lVar3 + 8);
          local_28 = QWidget::rect((QWidget *)(this->m_widget).wp.value);
          pDVar2 = (this->m_widget).wp.d;
          if ((pDVar2 == (Data *)0x0) || (*(int *)(pDVar2 + 4) == 0)) {
            pQVar4 = (QWidget *)0x0;
          }
          else {
            pQVar4 = (QWidget *)(this->m_widget).wp.value;
          }
          QWidgetRepaintManager::markDirty<QRect>
                    (this_00,&local_28,pQVar4,UpdateLater,BufferInvalid);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetWindow::scheduleRepaint()
{
    if (!screen())
        return;

    if (!m_widget->isVisible() || !m_widget->updatesEnabled() || !m_widget->rect().isValid())
        return;

    QTLWExtra *tlwExtra = m_widget->window()->d_func()->maybeTopData();
    if (tlwExtra && tlwExtra->backingStore) {
        tlwExtra->repaintManager->markDirty(m_widget->rect(), m_widget,
            QWidgetRepaintManager::UpdateLater, QWidgetRepaintManager::BufferInvalid);
    }
}